

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardEuler.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::integrators::ForwardEuler::allocateBuffers(ForwardEuler *this)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  element_type *peVar4;
  size_t sVar5;
  reference pvVar6;
  mapped_type *pmVar7;
  key_type *__k;
  element_type *peVar8;
  SparsityStructure *this_00;
  long in_RDI;
  size_t i;
  uint nu;
  uint nx;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
  *in_stack_fffffffffffffe78;
  SparsityStructure *in_stack_fffffffffffffe80;
  size_t in_stack_fffffffffffffe88;
  SparsityStructure *in_stack_fffffffffffffe90;
  size_type in_stack_fffffffffffffe98;
  vector<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
  *in_stack_fffffffffffffea0;
  MatrixDynSize *in_stack_fffffffffffffea8;
  key_type *in_stack_fffffffffffffeb8;
  map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
  *in_stack_fffffffffffffec0;
  CollocationHessianIndex local_f8;
  CollocationHessianIndex local_e8;
  CollocationHessianIndex local_d8;
  CollocationHessianIndex local_c8;
  CollocationHessianIndex local_b8;
  CollocationHessianIndex local_a8;
  CollocationHessianIndex local_98;
  CollocationHessianIndex local_88;
  CollocationHessianIndex local_78;
  CollocationHessianIndex local_68;
  ulong local_58;
  uint local_18;
  uint local_14;
  bool local_1;
  
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x10));
  if (bVar2) {
    peVar4 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3a67fa);
    sVar5 = DynamicalSystem::stateSpaceSize(peVar4);
    local_14 = (uint)sVar5;
    peVar4 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3a681a);
    sVar5 = DynamicalSystem::controlSpaceSize(peVar4);
    local_18 = (uint)sVar5;
    iDynTree::VectorDynSize::resize(in_RDI + 0x58);
    iDynTree::MatrixDynSize::resize(in_RDI + 200,(ulong)local_14);
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::Identity
              ((Index)in_stack_fffffffffffffea8,(Index)in_stack_fffffffffffffea0);
    toEigen(in_stack_fffffffffffffea8);
    Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>::operator=
              ((Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)
               in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    iDynTree::MatrixDynSize::resize(in_RDI + 0x78,(ulong)local_14);
    iDynTree::MatrixDynSize::zero();
    iDynTree::MatrixDynSize::resize(in_RDI + 0xa0,(ulong)local_14);
    iDynTree::MatrixDynSize::zero();
    iDynTree::MatrixDynSize::resize(in_RDI + 0xf0,(ulong)local_14);
    iDynTree::MatrixDynSize::zero();
    iDynTree::MatrixDynSize::resize(in_RDI + 0x140,(ulong)local_14);
    iDynTree::MatrixDynSize::zero();
    iDynTree::MatrixDynSize::resize(in_RDI + 0x118,(ulong)local_18);
    iDynTree::MatrixDynSize::zero();
    iDynTree::MatrixDynSize::resize(in_RDI + 0x168,(ulong)local_14);
    iDynTree::MatrixDynSize::zero();
    iDynTree::MatrixDynSize::resize(in_RDI + 400,(ulong)local_18);
    iDynTree::MatrixDynSize::zero();
    iDynTree::MatrixDynSize::resize(in_RDI + 0x1b8,(ulong)local_14);
    iDynTree::MatrixDynSize::zero();
    iDynTree::VectorDynSize::resize(in_RDI + 0x1e0);
    std::
    vector<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
    ::resize(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    std::
    vector<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
    ::resize(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    peVar4 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3a6ae3);
    pvVar6 = std::
             vector<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
             ::operator[]((vector<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
                           *)(in_RDI + 0x208),0);
    uVar3 = (*peVar4->_vptr_DynamicalSystem[0xb])(peVar4,pvVar6);
    if ((uVar3 & 1) != 0) {
      std::
      vector<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
      ::operator[]((vector<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
                    *)(in_RDI + 0x208),1);
      SparsityStructure::clear(in_stack_fffffffffffffe80);
      local_58 = 0;
      while( true ) {
        uVar1 = local_58;
        peVar4 = std::
                 __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x3a6b68);
        sVar5 = DynamicalSystem::stateSpaceSize(peVar4);
        if (sVar5 <= uVar1) break;
        std::
        vector<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
        ::operator[]((vector<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
                      *)(in_RDI + 0x208),0);
        SparsityStructure::add
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                   (size_t)in_stack_fffffffffffffe80);
        std::
        vector<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
        ::operator[]((vector<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
                      *)(in_RDI + 0x208),1);
        SparsityStructure::add
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                   (size_t)in_stack_fffffffffffffe80);
        local_58 = local_58 + 1;
      }
      *(undefined1 *)(in_RDI + 0x200) = 1;
    }
    peVar4 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3a6c17);
    pvVar6 = std::
             vector<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
             ::operator[]((vector<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
                           *)(in_RDI + 0x220),0);
    uVar3 = (*peVar4->_vptr_DynamicalSystem[0xc])(peVar4,pvVar6);
    if ((uVar3 & 1) != 0) {
      std::
      vector<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
      ::operator[]((vector<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
                    *)(in_RDI + 0x220),1);
      SparsityStructure::clear(in_stack_fffffffffffffe80);
      *(undefined1 *)(in_RDI + 0x201) = 1;
    }
    peVar4 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3a6c89);
    CollocationHessianIndex::CollocationHessianIndex(&local_68,0,0);
    pmVar7 = std::
             map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
             ::operator[](in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    uVar3 = (*peVar4->_vptr_DynamicalSystem[0x10])(peVar4,pmVar7);
    if ((uVar3 & 1) != 0) {
      CollocationHessianIndex::CollocationHessianIndex(&local_78,0,1);
      std::
      map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
      ::operator[](in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      SparsityStructure::clear(in_stack_fffffffffffffe80);
      CollocationHessianIndex::CollocationHessianIndex(&local_88,1,1);
      std::
      map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
      ::operator[](in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      SparsityStructure::clear(in_stack_fffffffffffffe80);
      *(undefined1 *)(in_RDI + 0x238) = 1;
    }
    peVar4 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3a6d89);
    __k = (key_type *)(in_RDI + 0x270);
    CollocationHessianIndex::CollocationHessianIndex(&local_98,0,0);
    pmVar7 = std::
             map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
             ::operator[]((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
                           *)peVar4,__k);
    uVar3 = (*peVar4->_vptr_DynamicalSystem[0x11])(peVar4,pmVar7);
    if ((uVar3 & 1) != 0) {
      CollocationHessianIndex::CollocationHessianIndex(&local_a8,0,1);
      std::
      map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
      ::operator[]((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
                    *)peVar4,__k);
      SparsityStructure::clear(in_stack_fffffffffffffe80);
      CollocationHessianIndex::CollocationHessianIndex(&local_b8,1,0);
      std::
      map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
      ::operator[]((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
                    *)peVar4,__k);
      SparsityStructure::clear(in_stack_fffffffffffffe80);
      CollocationHessianIndex::CollocationHessianIndex(&local_c8,1,1);
      std::
      map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
      ::operator[]((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
                    *)peVar4,__k);
      SparsityStructure::clear(in_stack_fffffffffffffe80);
      *(undefined1 *)(in_RDI + 0x239) = 1;
    }
    peVar8 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3a6ecc);
    CollocationHessianIndex::CollocationHessianIndex(&local_d8,0,0);
    pmVar7 = std::
             map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
             ::operator[]((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
                           *)peVar4,__k);
    uVar3 = (*peVar8->_vptr_DynamicalSystem[0x12])(peVar8,pmVar7);
    if ((uVar3 & 1) != 0) {
      this_00 = (SparsityStructure *)(in_RDI + 0x2a0);
      CollocationHessianIndex::CollocationHessianIndex(&local_e8,0,1);
      std::
      map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
      ::operator[]((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
                    *)peVar4,__k);
      SparsityStructure::clear(this_00);
      CollocationHessianIndex::CollocationHessianIndex(&local_f8,1,1);
      std::
      map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
      ::operator[]((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
                    *)peVar4,__k);
      SparsityStructure::clear(this_00);
      *(undefined1 *)(in_RDI + 0x23a) = 1;
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ForwardEuler::allocateBuffers()
            {
                if (!m_dynamicalSystem_ptr) {
                    return false;
                }

                unsigned int nx = static_cast<unsigned int>(m_dynamicalSystem_ptr->stateSpaceSize());
                unsigned int nu = static_cast<unsigned int>(m_dynamicalSystem_ptr->controlSpaceSize());

                m_computationBuffer.resize(nx);

                m_identity.resize(nx, nx);
                toEigen(m_identity) = iDynTreeEigenMatrix::Identity(nx, nx);

                m_stateJacBuffer.resize(nx, nx);
                m_stateJacBuffer.zero();
                m_controlJacBuffer.resize(nx,nu);
                m_controlJacBuffer.zero();
                m_zeroNxNxBuffer.resize(nx,nx);
                m_zeroNxNxBuffer.zero();
                m_zeroNxNuBuffer.resize(nx,nu);
                m_zeroNxNuBuffer.zero();
                m_zeroNuNuBuffer.resize(nu,nu);
                m_zeroNuNuBuffer.zero();

                m_stateHessianBuffer.resize(nx, nx);
                m_stateHessianBuffer.zero();
                m_controlHessianBuffer.resize(nu, nu);
                m_controlHessianBuffer.zero();
                m_mixedHessianBuffer.resize(nx, nu);
                m_mixedHessianBuffer.zero();

                m_lambda.resize(nx);

                m_stateJacobianSparsity.resize(2);
                m_controlJacobianSparsity.resize(2);

                if (m_dynamicalSystem_ptr->dynamicsStateFirstDerivativeSparsity(m_stateJacobianSparsity[0])) {
                    m_stateJacobianSparsity[1].clear();

                    for (size_t i = 0; i < m_dynamicalSystem_ptr->stateSpaceSize(); ++i) {
                        m_stateJacobianSparsity[0].add(i, i);
                        m_stateJacobianSparsity[1].add(i, i);
                    }

                    m_hasStateJacobianSparsity = true;
                }

                if (m_dynamicalSystem_ptr->dynamicsControlFirstDerivativeSparsity(m_controlJacobianSparsity[0])) {
                    m_controlJacobianSparsity[1].clear();

                    m_hasControlJacobianSparsity = true;
                }

                if (m_dynamicalSystem_ptr->dynamicsSecondPartialDerivativeWRTStateSparsity(m_stateHessianSparsity[CollocationHessianIndex(0, 0)])) {
                    m_stateHessianSparsity[CollocationHessianIndex(0, 1)].clear();
                    m_stateHessianSparsity[CollocationHessianIndex(1, 1)].clear();

                    m_hasStateHessianSparsity = true;
                }

                if (m_dynamicalSystem_ptr->dynamicsSecondPartialDerivativeWRTStateControlSparsity(m_stateControlHessianSparsity[CollocationHessianIndex(0, 0)])) {
                    m_stateControlHessianSparsity[CollocationHessianIndex(0, 1)].clear();
                    m_stateControlHessianSparsity[CollocationHessianIndex(1, 0)].clear();
                    m_stateControlHessianSparsity[CollocationHessianIndex(1, 1)].clear();

                    m_hasStateControlHessianSparsity = true;
                }

                if (m_dynamicalSystem_ptr->dynamicsSecondPartialDerivativeWRTControlSparsity(m_controlHessianSparsity[CollocationHessianIndex(0, 0)])) {
                    m_controlHessianSparsity[CollocationHessianIndex(0, 1)].clear();
                    m_controlHessianSparsity[CollocationHessianIndex(1, 1)].clear();

                    m_hasControlHessianSparsity = true;
                }

                return true;
            }